

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeFolding.cpp
# Opt level: O0

void __thiscall wasm::CodeFolding::visitReturn(CodeFolding *this,Return *curr)

{
  Block *pBVar1;
  bool bVar2;
  Expression **ppEVar3;
  Tail local_50;
  Tail local_38;
  Block *local_20;
  Block *parent;
  Return *curr_local;
  CodeFolding *this_local;
  
  parent = (Block *)curr;
  curr_local = (Return *)this;
  bVar2 = SmallVector<wasm::Expression_*,_10UL>::empty
                    (&(this->
                      super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>_>
                      ).
                      super_ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>
                      .controlFlowStack);
  if (!bVar2) {
    ppEVar3 = SmallVector<wasm::Expression_*,_10UL>::back
                        (&(this->
                          super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>_>
                          ).
                          super_ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>
                          .controlFlowStack);
    local_20 = Expression::dynCast<wasm::Block>(*ppEVar3);
    pBVar1 = parent;
    if ((local_20 != (Block *)0x0) &&
       (ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                            (&(local_20->list).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ), pBVar1 == (Block *)*ppEVar3)) {
      Tail::Tail(&local_38,(Expression *)parent,local_20);
      std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::push_back
                (&this->returnTails,&local_38);
      return;
    }
  }
  pBVar1 = parent;
  ppEVar3 = Walker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>::getCurrentPointer
                      ((Walker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_> *)
                       &(this->
                        super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>_>
                        ).
                        super_ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>
                      );
  Tail::Tail(&local_50,(Expression *)pBVar1,ppEVar3);
  std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::push_back
            (&this->returnTails,&local_50);
  return;
}

Assistant:

void visitReturn(Return* curr) {
    if (!controlFlowStack.empty()) {
      // we can easily optimize if we are at the end of the parent block
      Block* parent = controlFlowStack.back()->dynCast<Block>();
      if (parent && curr == parent->list.back()) {
        returnTails.push_back(Tail(curr, parent));
        return;
      }
    }
    // otherwise, if we have a large value, it might be worth optimizing us as
    // well
    returnTails.push_back(Tail(curr, getCurrentPointer()));
  }